

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O0

JL_STATUS JlBufferAdd(JlBuffer *BufferContext,void *Data,size_t DataSize)

{
  size_t NewSize;
  uint8_t *puVar1;
  uint8_t *newBuffer;
  size_t newSize;
  size_t amountLeft;
  JL_STATUS jlStatus;
  size_t DataSize_local;
  void *Data_local;
  JlBuffer *BufferContext_local;
  
  if (((BufferContext == (JlBuffer *)0x0) || (Data == (void *)0x0)) || (DataSize == 0)) {
    amountLeft._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    if (BufferContext->BufferAllocated - BufferContext->BufferUsed < DataSize) {
      NewSize = BufferContext->BufferAllocated + 0x4000;
      puVar1 = (uint8_t *)JlRealloc(BufferContext->Buffer,BufferContext->BufferAllocated,NewSize);
      if (puVar1 == (uint8_t *)0x0) {
        amountLeft._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        BufferContext->BufferAllocated = NewSize;
        BufferContext->Buffer = puVar1;
        amountLeft._4_4_ = JL_STATUS_SUCCESS;
      }
    }
    else {
      amountLeft._4_4_ = JL_STATUS_SUCCESS;
    }
    if (amountLeft._4_4_ == JL_STATUS_SUCCESS) {
      memcpy(BufferContext->Buffer + BufferContext->BufferUsed,Data,DataSize);
      BufferContext->BufferUsed = DataSize + BufferContext->BufferUsed;
    }
  }
  return amountLeft._4_4_;
}

Assistant:

JL_STATUS
    JlBufferAdd
    (
        JlBuffer*       BufferContext,
        void const*     Data,
        size_t          DataSize
    )
{
    JL_STATUS jlStatus;

    if(     NULL != BufferContext
        &&  NULL != Data
        &&  0 != DataSize )
    {
        size_t amountLeft = BufferContext->BufferAllocated - BufferContext->BufferUsed;
        if( amountLeft < DataSize )
        {
            size_t   newSize = BufferContext->BufferAllocated + BUFFER_GROW_SIZE;
            uint8_t* newBuffer = JlRealloc( BufferContext->Buffer, BufferContext->BufferAllocated, newSize );

            if( NULL != newBuffer )
            {
                BufferContext->BufferAllocated = newSize;
                BufferContext->Buffer = newBuffer;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            // No need to grow buffer
            jlStatus = JL_STATUS_SUCCESS;
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Append data
            memcpy( BufferContext->Buffer + BufferContext->BufferUsed, Data, DataSize );
            BufferContext->BufferUsed += DataSize;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}